

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advconsole.unix.cpp
# Opt level: O0

char getUnbufKey(void)

{
  int iVar1;
  undefined1 local_80 [7];
  char cKey;
  termios oTermNew;
  termios oTermOld;
  
  tcgetattr(0,(termios *)&oTermNew.c_ispeed);
  memcpy(local_80,&oTermNew.c_ispeed,0x3c);
  oTermNew.c_oflag = oTermNew.c_oflag & 0xfffffff5;
  tcsetattr(0,0,(termios *)local_80);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&oTermNew.c_ispeed);
  return (char)iVar1;
}

Assistant:

char getUnbufKey()
{
	termios oTermOld, oTermNew;
	tcgetattr(STDIN_FILENO, &oTermOld);
	oTermNew = oTermOld;
	oTermNew.c_lflag &= ~(ICANON | ECHO);
	
	tcsetattr(STDIN_FILENO, TCSANOW, &oTermNew);
	char cKey = getchar();
	tcsetattr(STDIN_FILENO, TCSANOW, &oTermOld);
	return cKey;
}